

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_tests.cpp
# Opt level: O2

void __thiscall SetUpSkipTest::SetUp(SetUpSkipTest *this)

{
  bool bVar1;
  char *message;
  iuCodeMessage local_1c0;
  iuStreamMessage local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::iuStreamMessage::operator<<(&local_190,(char (*) [14])"skip in SetUp");
  bVar1 = iutest::UnitTestImpl::SkipTest();
  message = "Skipped. but already failed. ";
  if (bVar1) {
    message = "Skipped. ";
  }
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/skip_tests.cpp"
             ,0x44,message);
  local_1c0._44_4_ = 0xfffffffe;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  return;
}

Assistant:

IUTEST_CXX_OVERRIDE IUTEST_CXX_FINAL
    {
        IUTEST_SKIP() << "skip in SetUp";
    }